

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONWorkflowPresets.cxx
# Opt level: O0

ReadFileResult anon_unknown.dwarf_9005bd::WorkflowStepTypeHelper(Type *out,Value *value)

{
  bool bVar1;
  String local_b0;
  String local_90;
  String local_70;
  String local_40;
  Value *local_20;
  Value *value_local;
  Type *out_local;
  
  if (value == (Value *)0x0) {
    out_local._4_4_ = INVALID_PRESET;
  }
  else {
    local_20 = value;
    value_local = (Value *)out;
    bVar1 = Json::Value::isString(value);
    if (bVar1) {
      Json::Value::asString_abi_cxx11_(&local_40,local_20);
      bVar1 = std::operator==(&local_40,"configure");
      std::__cxx11::string::~string((string *)&local_40);
      if (bVar1) {
        *(undefined4 *)&value_local->value_ = 0;
        out_local._4_4_ = READ_OK;
      }
      else {
        Json::Value::asString_abi_cxx11_(&local_70,local_20);
        bVar1 = std::operator==(&local_70,"build");
        std::__cxx11::string::~string((string *)&local_70);
        if (bVar1) {
          *(undefined4 *)&value_local->value_ = 1;
          out_local._4_4_ = READ_OK;
        }
        else {
          Json::Value::asString_abi_cxx11_(&local_90,local_20);
          bVar1 = std::operator==(&local_90,"test");
          std::__cxx11::string::~string((string *)&local_90);
          if (bVar1) {
            *(undefined4 *)&value_local->value_ = 2;
            out_local._4_4_ = READ_OK;
          }
          else {
            Json::Value::asString_abi_cxx11_(&local_b0,local_20);
            bVar1 = std::operator==(&local_b0,"package");
            std::__cxx11::string::~string((string *)&local_b0);
            if (bVar1) {
              *(undefined4 *)&value_local->value_ = 3;
              out_local._4_4_ = READ_OK;
            }
            else {
              out_local._4_4_ = INVALID_PRESET;
            }
          }
        }
      }
    }
    else {
      out_local._4_4_ = INVALID_PRESET;
    }
  }
  return out_local._4_4_;
}

Assistant:

ReadFileResult WorkflowStepTypeHelper(WorkflowPreset::WorkflowStep::Type& out,
                                      const Json::Value* value)
{
  if (!value) {
    return ReadFileResult::INVALID_PRESET;
  }

  if (!value->isString()) {
    return ReadFileResult::INVALID_PRESET;
  }

  if (value->asString() == "configure") {
    out = WorkflowPreset::WorkflowStep::Type::Configure;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "build") {
    out = WorkflowPreset::WorkflowStep::Type::Build;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "test") {
    out = WorkflowPreset::WorkflowStep::Type::Test;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "package") {
    out = WorkflowPreset::WorkflowStep::Type::Package;
    return ReadFileResult::READ_OK;
  }

  return ReadFileResult::INVALID_PRESET;
}